

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

int cmp(void *param_1,void *param_2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = *(int *)((long)param_1 + 0x14) - *(int *)((long)param_2 + 0x14);
  if (iVar3 != 0) {
    return iVar3;
  }
  lVar4 = (long)*(int *)((long)param_2 + 0x14) * 4 + 0x1c;
  do {
    uVar1 = *(uint *)((long)param_1 + lVar4 + -8);
    uVar2 = *(uint *)((long)param_2 + lVar4 + -8);
    if (uVar1 != uVar2) {
      return -(uint)(uVar1 < uVar2) | 1;
    }
    lVar4 = lVar4 + -4;
  } while (0x1c < lVar4);
  return 0;
}

Assistant:

static int
cmp(Bigint *a, Bigint *b)
{
    ULong *xa, *xa0, *xb, *xb0;
    int i, j;

    i = a->wds;
    j = b->wds;
#ifdef DEBUG
    if (i > 1 && !a->x[i-1])
        Bug("cmp called with a->x[a->wds-1] == 0");
    if (j > 1 && !b->x[j-1])
        Bug("cmp called with b->x[b->wds-1] == 0");
#endif
    if (i -= j)
        return i;
    xa0 = a->x;
    xa = xa0 + j;
    xb0 = b->x;
    xb = xb0 + j;
    for(;;) {
        if (*--xa != *--xb)
            return *xa < *xb ? -1 : 1;
        if (xa <= xa0)
            break;
    }
    return 0;
}